

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O2

void sptk::world::histc(double *x,int x_length,double *edges,int edges_length,int *index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar7 = 0;
  uVar4 = 0;
  if (0 < edges_length) {
    uVar4 = (ulong)(uint)edges_length;
  }
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    index[uVar7] = 1;
    if (*x <= edges[uVar7]) {
      uVar4 = uVar7 & 0xffffffff;
      break;
    }
  }
  uVar7 = 1;
  while( true ) {
    iVar6 = (int)uVar7;
    iVar2 = (int)uVar4;
    iVar3 = iVar2;
    if (edges_length <= iVar2) break;
    bVar1 = x[uVar7] < edges[iVar2] || x[uVar7] == edges[iVar2];
    uVar8 = iVar6 + (uint)bVar1;
    iVar3 = iVar2 - (uint)bVar1;
    index[iVar2] = iVar6;
    iVar6 = x_length;
    if (uVar8 == x_length) break;
    uVar4 = (ulong)(iVar3 + 1);
    uVar7 = (ulong)uVar8;
  }
  lVar5 = (long)iVar3;
  while (lVar5 = lVar5 + 1, lVar5 < edges_length) {
    index[lVar5] = iVar6 + -1;
  }
  return;
}

Assistant:

void histc(const double *x, int x_length, const double *edges,
    int edges_length, int *index) {
  int count = 1;

  int i = 0;
  for (; i < edges_length; ++i) {
    index[i] = 1;
    if (edges[i] >= x[0]) break;
  }
  for (; i < edges_length; ++i) {
    if (edges[i] < x[count]) {
      index[i] = count;
    } else {
      index[i--] = count++;
    }
    if (count == x_length) break;
  }
  count--;
  for (i++; i < edges_length; ++i) index[i] = count;
}